

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

int safe_pcre2_match_16(pcre2_code_16 *code,PCRE2_SPTR16 subject,qsizetype length,
                       qsizetype startOffset,int options,pcre2_match_data_16 *matchData,
                       pcre2_match_context_16 *matchContext)

{
  bool bVar1;
  unique_ptr<pcre2_real_jit_stack_16,_(anonymous_namespace)::PcreJitStackFree> *this;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  pointer in_stack_00000008;
  int result;
  pointer __p;
  undefined4 local_34;
  
  __p = in_stack_00000008;
  local_34 = pcre2_match_16(in_RDI,in_RSI,in_RDX,in_RCX,in_R8D,in_R9);
  if (local_34 == -0x2e) {
    _ZTWN12_GLOBAL__N_19jitStacksE();
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<pcre2_real_jit_stack_16,_(anonymous_namespace)::PcreJitStackFree>
                        *)0x72d11b);
    if (!bVar1) {
      this = (unique_ptr<pcre2_real_jit_stack_16,_(anonymous_namespace)::PcreJitStackFree> *)
             _ZTWN12_GLOBAL__N_19jitStacksE();
      pcre2_jit_stack_create_16(0x8000,0x80000,0);
      std::unique_ptr<pcre2_real_jit_stack_16,_(anonymous_namespace)::PcreJitStackFree>::reset
                (this,__p);
      local_34 = pcre2_match_16(in_RDI,in_RSI,in_RDX,in_RCX,in_R8D,in_R9,in_stack_00000008);
    }
  }
  return local_34;
}

Assistant:

static int safe_pcre2_match_16(const pcre2_code_16 *code,
                               PCRE2_SPTR16 subject, qsizetype length,
                               qsizetype startOffset, int options,
                               pcre2_match_data_16 *matchData,
                               pcre2_match_context_16 *matchContext)
{
    int result = pcre2_match_16(code, subject, length,
                                startOffset, options, matchData, matchContext);

    if (result == PCRE2_ERROR_JIT_STACKLIMIT && !jitStacks) {
        // The default JIT stack size in PCRE is 32K,
        // we allocate from 32K up to 512K.
        jitStacks.reset(pcre2_jit_stack_create_16(32 * 1024, 512 * 1024, NULL));

        result = pcre2_match_16(code, subject, length,
                                startOffset, options, matchData, matchContext);
    }

    return result;
}